

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

uint __thiscall duckdb::Value::GetValueInternal<unsigned_int>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  char input;
  byte input_00;
  uint16_t input_01;
  short input_02;
  uint64_t uVar3;
  char *__s;
  TryCast *this_00;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  InvalidInputException *pIVar8;
  string *psVar9;
  size_t sVar10;
  NotImplementedException *pNVar11;
  InternalException *pIVar12;
  int64_t iVar13;
  uint64_t uVar14;
  undefined8 uVar15;
  char input_03;
  bool input_04;
  uchar input_05;
  duckdb *pdVar16;
  undefined1 in_R8B;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  hugeint_t input_06;
  uhugeint_t input_07;
  string_t input_08;
  string_t input_09;
  unkbyte10 Var19;
  uint result;
  LogicalType local_b0;
  Value local_98;
  double local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (this->is_null == true) {
    pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar12,(string *)&local_98);
    __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    bVar5 = (this->value_).boolean;
    bVar6 = TryCast::Operation<bool,unsigned_int>(bVar5,(uint32_t *)&local_b0,false);
    if (!bVar6) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<bool,unsigned_int>((string *)&local_98,(duckdb *)(ulong)bVar5,input_04);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TINYINT:
    input = (this->value_).tinyint;
    bVar5 = TryCast::Operation<signed_char,unsigned_int>(input,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,unsigned_int>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input,input_03);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case SMALLINT:
    input_02 = (this->value_).smallint;
    bVar5 = TryCast::Operation<short,unsigned_int>(input_02,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      Var19 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,unsigned_int>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input_02,
                 (short)((unkuint10)Var19 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var19,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var19,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case INTEGER:
    uVar7 = (this->value_).integer;
    bVar5 = TryCast::Operation<int,unsigned_int>(uVar7,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      auVar17 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,unsigned_int>((string *)&local_98,(duckdb *)(ulong)uVar7,auVar17._8_4_);
      InvalidInputException::InvalidInputException(auVar17._0_8_,(string *)&local_98);
      __cxa_throw(auVar17._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case BIGINT:
    pdVar16 = (duckdb *)(this->value_).bigint;
    bVar5 = TryCast::Operation<long,unsigned_int>((int64_t)pdVar16,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,unsigned_int>((string *)&local_98,pdVar16,auVar18._8_8_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case DATE:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT32,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_MS:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_NS:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_b0,DOUBLE);
    DefaultCastAs(&local_98,this,&local_b0,false);
    uVar7 = GetValueInternal<unsigned_int>(&local_98);
    ~Value(&local_98);
    LogicalType::~LogicalType(&local_b0);
    local_b0._0_4_ = uVar7;
    break;
  case FLOAT:
    local_58 = (double)CONCAT44(local_58._4_4_,(this->value_).float_);
    pdVar16 = (duckdb *)0x0;
    bVar5 = TryCast::Operation<float,unsigned_int>
                      ((this->value_).float_,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,unsigned_int>((string *)&local_98,pdVar16,local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case DOUBLE:
    local_58 = (this->value_).double_;
    pdVar16 = (duckdb *)0x0;
    bVar5 = TryCast::Operation<double,unsigned_int>(local_58,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,unsigned_int>((string *)&local_98,pdVar16,local_58);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case VARCHAR:
    psVar9 = StringValue::Get_abi_cxx11_(this);
    __s = (psVar9->_M_dataplus)._M_p;
    sVar10 = strlen(__s);
    local_50 = (uint)sVar10;
    if (local_50 < 0xd) {
      uStack_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (local_50 != 0) {
        switchD_01602a8a::default(&uStack_4c,__s,(ulong)(local_50 & 0xf));
      }
    }
    else {
      uStack_4c = *(undefined4 *)__s;
      uStack_48 = SUB84(__s,0);
      uStack_44 = (undefined4)((ulong)__s >> 0x20);
    }
    this_00 = (TryCast *)CONCAT44(uStack_4c,local_50);
    uVar4 = CONCAT44(uStack_44,uStack_48);
    uVar15 = 0;
    input_09.value.pointer.ptr = (char *)&local_b0;
    input_09.value._0_8_ = uVar4;
    bVar5 = TryCast::Operation<duckdb::string_t,unsigned_int>
                      (this_00,input_09,(uint32_t *)0x0,(bool)in_R8B);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_08.value.pointer.ptr = (char *)uVar15;
      input_08.value._0_8_ = uVar4;
      CastExceptionText<duckdb::string_t,unsigned_int>
                ((string *)&local_98,(duckdb *)this_00,input_08);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case INTERVAL:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INTERVAL,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    input_00 = (this->value_).utinyint;
    bVar5 = TryCast::Operation<unsigned_char,unsigned_int>(input_00,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_char,unsigned_int>
                ((string *)&local_98,(duckdb *)(ulong)input_00,input_05);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case USMALLINT:
    input_01 = (this->value_).usmallint;
    bVar5 = TryCast::Operation<unsigned_short,unsigned_int>(input_01,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      Var19 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_short,unsigned_int>
                ((string *)&local_98,(duckdb *)(ulong)input_01,
                 (unsigned_short)((unkuint10)Var19 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var19,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var19,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UINTEGER:
    uVar7 = (this->value_).uinteger;
    bVar5 = TryCast::Operation<unsigned_int,unsigned_int>(uVar7,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      auVar17 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_int,unsigned_int>
                ((string *)&local_98,(duckdb *)(ulong)uVar7,auVar17._8_4_);
      InvalidInputException::InvalidInputException(auVar17._0_8_,(string *)&local_98);
      __cxa_throw(auVar17._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UBIGINT:
    pdVar16 = (duckdb *)(this->value_).ubigint;
    bVar5 = TryCast::Operation<unsigned_long,unsigned_int>
                      ((uint64_t)pdVar16,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_long,unsigned_int>((string *)&local_98,pdVar16,auVar18._8_8_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_TZ:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INT64,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar11,(string *)&local_98,INVALID,UINT32);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pdVar16 = (duckdb *)(this->value_).hugeint.lower;
    uVar3 = (this->value_).hugeint.upper;
    uVar14 = 0;
    bVar5 = TryCast::Operation<duckdb::uhugeint_t,unsigned_int>
                      ((this->value_).uhugeint,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_07.upper = uVar14;
      input_07.lower = uVar3;
      CastExceptionText<duckdb::uhugeint_t,unsigned_int>((string *)&local_98,pdVar16,input_07);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case HUGEINT:
  case UUID:
    pdVar16 = (duckdb *)(this->value_).hugeint.lower;
    uVar3 = (this->value_).hugeint.upper;
    iVar13 = 0;
    bVar5 = TryCast::Operation<duckdb::hugeint_t,unsigned_int>
                      ((this->value_).hugeint,(uint32_t *)&local_b0,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_06.upper = iVar13;
      input_06.lower = uVar3;
      CastExceptionText<duckdb::hugeint_t,unsigned_int>((string *)&local_98,pdVar16,input_06);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_98);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) {
        uVar7 = Cast::Operation<unsigned_int,unsigned_int>((this->value_).uinteger);
        return uVar7;
      }
      if (PVar2 == UINT16) {
        uVar7 = Cast::Operation<unsigned_short,unsigned_int>((this->value_).usmallint);
        return uVar7;
      }
      if (PVar2 != UINT8) {
        pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98.type_._0_8_ =
             &local_98.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid Internal Type for ENUMs","");
        InternalException::InternalException(pIVar12,(string *)&local_98);
        __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar7 = Cast::Operation<unsigned_char,unsigned_int>((this->value_).utinyint);
      return uVar7;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar11,(string *)&local_98,&local_40);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return local_b0._0_4_;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}